

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O2

void __thiscall pow_tests::get_next_work::test_method(get_next_work *this)

{
  long lVar1;
  readonly_property65 rVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  assertion_result *paVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  uint *puVar5;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  assertion_result local_158;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  lazy_ostream local_110;
  undefined1 *local_100;
  char **local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  uint expected_nbits;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams;
  CBlockIndex pindexLast;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&chainParams,
                    (ChainType)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  CBlockIndex::CBlockIndex(&pindexLast);
  pindexLast.nHeight = 0x7dff;
  pindexLast.nTime = 0x4b3aec23;
  pindexLast.nBits = 0x1d00ffff;
  expected_nbits = 0x1d00d86a;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1f;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (char **)0xc7f1cc;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_118 = "";
  local_158._0_4_ =
       CalculateNextWorkRequired
                 (&pindexLast,0x4b2b51b1,
                  (Params *)
                  chainParams._M_t.
                  super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                  .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  paVar4 = &local_158;
  puVar5 = &expected_nbits;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_110,&local_120,0x1f,1,2,paVar4,
             "CalculateNextWorkRequired(&pindexLast, nLastRetargetTime, chainParams->GetConsensus())"
             ,puVar5,"expected_nbits");
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x20;
  file_00.m_begin = (iterator)&local_130;
  msg_00.m_end = (iterator)paVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       PermittedDifficultyTransition
                 ((Params *)
                  chainParams._M_t.
                  super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                  .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl,
                  (long)pindexLast.nHeight + 1,pindexLast.nBits,expected_nbits);
  local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_158.m_message.px = (element_type *)0x0;
  local_158.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = &local_168;
  local_168 = 
  "PermittedDifficultyTransition(chainParams->GetConsensus(), pindexLast.nHeight+1, pindexLast.nBits, expected_nbits)"
  ;
  local_160 = "";
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_170 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_158,&local_110,1,0,WARN,(check_type)puVar5,(size_t)&local_178,0x20);
  boost::detail::shared_count::~shared_count(&local_158.m_message.pn);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&chainParams);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(get_next_work)
{
    const auto chainParams = CreateChainParams(*m_node.args, ChainType::MAIN);
    int64_t nLastRetargetTime = 1261130161; // Block #30240
    CBlockIndex pindexLast;
    pindexLast.nHeight = 32255;
    pindexLast.nTime = 1262152739;  // Block #32255
    pindexLast.nBits = 0x1d00ffff;

    // Here (and below): expected_nbits is calculated in
    // CalculateNextWorkRequired(); redoing the calculation here would be just
    // reimplementing the same code that is written in pow.cpp. Rather than
    // copy that code, we just hardcode the expected result.
    unsigned int expected_nbits = 0x1d00d86aU;
    BOOST_CHECK_EQUAL(CalculateNextWorkRequired(&pindexLast, nLastRetargetTime, chainParams->GetConsensus()), expected_nbits);
    BOOST_CHECK(PermittedDifficultyTransition(chainParams->GetConsensus(), pindexLast.nHeight+1, pindexLast.nBits, expected_nbits));
}